

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# thread-crosser.h
# Opt level: O0

function<void_()> * capture_thread::ThreadCrosser::WrapCall(function<void_()> *call)

{
  function<void_()> *in_RDI;
  function<void_()> *function;
  
  function = in_RDI;
  std::function<void_()>::function(in_RDI,in_RDI);
  WrapFunction<void>(function);
  std::function<void_()>::~function((function<void_()> *)0x109a34);
  return in_RDI;
}

Assistant:

static inline std::function<void()> WrapCall(std::function<void()> call) {
    return WrapFunction(std::move(call));
  }